

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

idx_t duckdb::BinaryExecutor::
      SelectGenericLoop<unsigned_char,unsigned_char,duckdb::GreaterThan,false,true,false>
                (uchar *ldata,uchar *rdata,SelectionVector *lsel,SelectionVector *rsel,
                SelectionVector *result_sel,idx_t count,ValidityMask *lvalidity,
                ValidityMask *rvalidity,SelectionVector *true_sel,SelectionVector *false_sel)

{
  bool bVar1;
  idx_t i;
  idx_t iVar2;
  idx_t row_idx;
  idx_t row_idx_00;
  idx_t iVar3;
  idx_t local_58;
  
  local_58 = 0;
  for (iVar2 = 0; count != iVar2; iVar2 = iVar2 + 1) {
    iVar3 = iVar2;
    if (result_sel->sel_vector != (sel_t *)0x0) {
      iVar3 = (idx_t)result_sel->sel_vector[iVar2];
    }
    row_idx_00 = iVar2;
    if (lsel->sel_vector != (sel_t *)0x0) {
      row_idx_00 = (idx_t)lsel->sel_vector[iVar2];
    }
    row_idx = iVar2;
    if (rsel->sel_vector != (sel_t *)0x0) {
      row_idx = (idx_t)rsel->sel_vector[iVar2];
    }
    bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (&lvalidity->super_TemplatedValidityMask<unsigned_long>,row_idx_00);
    if (bVar1) {
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&rvalidity->super_TemplatedValidityMask<unsigned_long>,row_idx);
      if ((bVar1) && (rdata[row_idx] < ldata[row_idx_00])) {
        true_sel->sel_vector[local_58] = (sel_t)iVar3;
        local_58 = local_58 + 1;
      }
    }
  }
  return local_58;
}

Assistant:

static inline idx_t
	SelectGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                  const SelectionVector *__restrict lsel, const SelectionVector *__restrict rsel,
	                  const SelectionVector *__restrict result_sel, idx_t count, ValidityMask &lvalidity,
	                  ValidityMask &rvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
#ifdef DUCKDB_SMALLER_BINARY
		const bool HAS_TRUE_SEL = true_sel;
		const bool HAS_FALSE_SEL = false_sel;
		const bool NO_NULL = false;
#endif
		for (idx_t i = 0; i < count; i++) {
			auto result_idx = result_sel->get_index(i);
			auto lindex = lsel->get_index(i);
			auto rindex = rsel->get_index(i);
			if ((NO_NULL || (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex))) &&
			    OP::Operation(ldata[lindex], rdata[rindex])) {
				if (HAS_TRUE_SEL) {
					true_sel->set_index(true_count++, result_idx);
				}
			} else {
				if (HAS_FALSE_SEL) {
					false_sel->set_index(false_count++, result_idx);
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}